

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

VkResult vmaCreateImage(VmaAllocator allocator,VkImageCreateInfo *pImageCreateInfo,
                       VmaAllocationCreateInfo *pAllocationCreateInfo,VkImage *pImage,
                       VmaAllocation *pAllocation,VmaAllocationInfo *pAllocationInfo)

{
  VmaVulkanFunctions *pVVar1;
  VkAllocationCallbacks *pVVar2;
  undefined8 *in_RCX;
  VmaAllocator_T *in_RDX;
  bool *in_RSI;
  VmaAllocator_T *in_RDI;
  VkImage in_R8;
  long in_R9;
  VkImage in_stack_00000008;
  VkBuffer in_stack_00000010;
  bool in_stack_0000001e;
  bool in_stack_0000001f;
  VkMemoryRequirements *in_stack_00000020;
  VmaAllocator_T *in_stack_00000028;
  VkFlags in_stack_00000070;
  bool prefersDedicatedAllocation;
  bool requiresDedicatedAllocation;
  VkMemoryRequirements vkMemReq;
  VmaSuballocationType suballocType;
  VkResult res;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff2c;
  VmaAllocator_T *this;
  void *pNext;
  VkImage pVVar4;
  VkDeviceSize in_stack_ffffffffffffff50;
  VkDevice pVVar5;
  VmaAllocation in_stack_ffffffffffffff58;
  VmaAllocator_T *in_stack_ffffffffffffff60;
  PFN_vkDestroyImage p_Var6;
  size_t in_stack_ffffffffffffff68;
  VmaAllocator_T *in_stack_ffffffffffffff70;
  bool *requiresDedicatedAllocation_00;
  VkMemoryRequirements *memReq;
  uint6 in_stack_ffffffffffffff98;
  VmaAllocator_T *in_stack_ffffffffffffffa0;
  VkResult local_44;
  VkResult local_c;
  
  if ((((*(int *)(in_RSI + 0x1c) == 0) || (*(int *)(in_RSI + 0x20) == 0)) ||
      (*(int *)(in_RSI + 0x24) == 0)) ||
     ((*(int *)(in_RSI + 0x28) == 0 || (*(int *)(in_RSI + 0x2c) == 0)))) {
    local_c = VK_ERROR_INITIALIZATION_FAILED;
  }
  else {
    *in_RCX = 0;
    *(undefined8 *)in_R8 = 0;
    pVVar1 = VmaAllocator_T::GetVulkanFunctions(in_RDI);
    memReq = (VkMemoryRequirements *)pVVar1->vkCreateImage;
    pVVar5 = in_RDI->m_hDevice;
    requiresDedicatedAllocation_00 = in_RSI;
    pVVar2 = VmaAllocator_T::GetAllocationCallbacks(in_RDI);
    local_c = (*(code *)memReq)(pVVar5,requiresDedicatedAllocation_00,pVVar2,in_RCX);
    if (VK_ERROR_OUT_OF_HOST_MEMORY < local_c) {
      memset(&stack0xffffffffffffffa0,0,0x18);
      VmaAllocator_T::GetImageMemoryRequirements
                (in_stack_ffffffffffffffa0,(VkImage)(ulong)in_stack_ffffffffffffff98,memReq,
                 requiresDedicatedAllocation_00,(bool *)pVVar5);
      uVar3 = *(undefined4 *)(in_RSI + 0x38);
      pNext = (void *)0x1;
      this = in_RDX;
      pVVar4 = in_R8;
      local_44 = VmaAllocator_T::AllocateMemory
                           (in_stack_00000028,in_stack_00000020,in_stack_0000001f,in_stack_0000001e,
                            in_stack_00000010,in_stack_00000008,in_stack_00000070,
                            (VmaAllocationCreateInfo *)vkMemReq.size,
                            (VmaSuballocationType)vkMemReq.alignment,vkMemReq._16_8_,_suballocType);
      if (local_44 < VK_SUCCESS) {
        pVVar1 = VmaAllocator_T::GetVulkanFunctions(in_RDI);
        p_Var6 = pVVar1->vkDestroyImage;
        pVVar5 = in_RDI->m_hDevice;
        pVVar4 = (VkImage)*in_RCX;
        pVVar2 = VmaAllocator_T::GetAllocationCallbacks(in_RDI);
        (*p_Var6)(pVVar5,pVVar4,pVVar2);
        *in_RCX = 0;
        local_c = local_44;
      }
      else {
        if (((undefined1  [5920])*in_RDX & (undefined1  [5920])0x80) == (undefined1  [5920])0x0) {
          local_44 = VmaAllocator_T::BindImageMemory
                               (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                                in_stack_ffffffffffffff50,pVVar4,pNext);
        }
        if (local_44 < VK_SUCCESS) {
          VmaAllocator_T::FreeMemory
                    (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                     (VmaAllocation *)in_stack_ffffffffffffff60);
          *(undefined8 *)in_R8 = 0;
          pVVar1 = VmaAllocator_T::GetVulkanFunctions(in_RDI);
          p_Var6 = pVVar1->vkDestroyImage;
          pVVar5 = in_RDI->m_hDevice;
          pVVar4 = (VkImage)*in_RCX;
          pVVar2 = VmaAllocator_T::GetAllocationCallbacks(in_RDI);
          (*p_Var6)(pVVar5,pVVar4,pVVar2);
          *in_RCX = 0;
          local_c = local_44;
        }
        else {
          VmaAllocation_T::InitBufferImageUsage
                    (*(VmaAllocation_T **)in_R8,*(uint32_t *)(in_RSI + 0x38));
          if (in_R9 != 0) {
            VmaAllocator_T::GetAllocationInfo
                      (this,(VmaAllocation)CONCAT44(in_stack_ffffffffffffff2c,uVar3),
                       (VmaAllocationInfo *)0x303dd2);
          }
          local_c = VK_SUCCESS;
        }
      }
    }
  }
  return local_c;
}

Assistant:

VMA_CALL_PRE VkResult VMA_CALL_POST vmaCreateImage(
    VmaAllocator allocator,
    const VkImageCreateInfo* pImageCreateInfo,
    const VmaAllocationCreateInfo* pAllocationCreateInfo,
    VkImage* pImage,
    VmaAllocation* pAllocation,
    VmaAllocationInfo* pAllocationInfo)
{
    VMA_ASSERT(allocator && pImageCreateInfo && pAllocationCreateInfo && pImage && pAllocation);

    if(pImageCreateInfo->extent.width == 0 ||
        pImageCreateInfo->extent.height == 0 ||
        pImageCreateInfo->extent.depth == 0 ||
        pImageCreateInfo->mipLevels == 0 ||
        pImageCreateInfo->arrayLayers == 0)
    {
        return VK_ERROR_INITIALIZATION_FAILED;
    }

    VMA_DEBUG_LOG("vmaCreateImage");

    VMA_DEBUG_GLOBAL_MUTEX_LOCK

    *pImage = VK_NULL_HANDLE;
    *pAllocation = VK_NULL_HANDLE;

    // 1. Create VkImage.
    VkResult res = (*allocator->GetVulkanFunctions().vkCreateImage)(
        allocator->m_hDevice,
        pImageCreateInfo,
        allocator->GetAllocationCallbacks(),
        pImage);
    if(res >= 0)
    {
        VmaSuballocationType suballocType = pImageCreateInfo->tiling == VK_IMAGE_TILING_OPTIMAL ?
            VMA_SUBALLOCATION_TYPE_IMAGE_OPTIMAL :
            VMA_SUBALLOCATION_TYPE_IMAGE_LINEAR;

        // 2. Allocate memory using allocator.
        VkMemoryRequirements vkMemReq = {};
        bool requiresDedicatedAllocation = false;
        bool prefersDedicatedAllocation  = false;
        allocator->GetImageMemoryRequirements(*pImage, vkMemReq,
            requiresDedicatedAllocation, prefersDedicatedAllocation);

        res = allocator->AllocateMemory(
            vkMemReq,
            requiresDedicatedAllocation,
            prefersDedicatedAllocation,
            VK_NULL_HANDLE, // dedicatedBuffer
            *pImage, // dedicatedImage
            pImageCreateInfo->usage, // dedicatedBufferImageUsage
            *pAllocationCreateInfo,
            suballocType,
            1, // allocationCount
            pAllocation);

        if(res >= 0)
        {
            // 3. Bind image with memory.
            if((pAllocationCreateInfo->flags & VMA_ALLOCATION_CREATE_DONT_BIND_BIT) == 0)
            {
                res = allocator->BindImageMemory(*pAllocation, 0, *pImage, VMA_NULL);
            }
            if(res >= 0)
            {
                // All steps succeeded.
                #if VMA_STATS_STRING_ENABLED
                    (*pAllocation)->InitBufferImageUsage(pImageCreateInfo->usage);
                #endif
                if(pAllocationInfo != VMA_NULL)
                {
                    allocator->GetAllocationInfo(*pAllocation, pAllocationInfo);
                }

                return VK_SUCCESS;
            }
            allocator->FreeMemory(
                1, // allocationCount
                pAllocation);
            *pAllocation = VK_NULL_HANDLE;
            (*allocator->GetVulkanFunctions().vkDestroyImage)(allocator->m_hDevice, *pImage, allocator->GetAllocationCallbacks());
            *pImage = VK_NULL_HANDLE;
            return res;
        }
        (*allocator->GetVulkanFunctions().vkDestroyImage)(allocator->m_hDevice, *pImage, allocator->GetAllocationCallbacks());
        *pImage = VK_NULL_HANDLE;
        return res;
    }
    return res;
}